

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int arena_i_extent_hooks_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  uint uVar1;
  arena_t *paVar2;
  ehooks_t *peVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  uint ind;
  size_t __n;
  extent_hooks_t *old_extent_hooks;
  arena_config_t config;
  
  malloc_mutex_lock((tsdn_t *)tsd,&ctl_mtx);
  uVar4 = mib[1];
  iVar6 = 0xe;
  if (uVar4 >> 0x20 != 0) goto LAB_01e7d43a;
  uVar1 = duckdb_je_narenas_total_get();
  ind = (uint)uVar4;
  if (uVar1 <= ind) goto LAB_01e7d43a;
  paVar2 = (arena_t *)duckdb_je_arenas[uVar4].repr;
  iVar5 = 0x16;
  if (paVar2 == (arena_t *)0x0) {
    iVar6 = 0xe;
    if (duckdb_je_narenas_auto <= ind) goto LAB_01e7d43a;
    old_extent_hooks = &duckdb_je_ehooks_default_extent_hooks;
    if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
      uVar4 = *oldlenp;
      if (uVar4 != 8) goto LAB_01e7d41b;
      *(extent_hooks_t **)oldp = &duckdb_je_ehooks_default_extent_hooks;
    }
    if (newp != (void *)0x0) {
      iVar6 = iVar5;
      if (newlen != 8) goto LAB_01e7d43a;
      config.extent_hooks = *newp;
      config.metadata_use_hooks = true;
      config._9_7_ = 0;
      paVar2 = duckdb_je_arena_init((tsdn_t *)tsd,ind,&config);
      iVar6 = 0xe;
      if (paVar2 == (arena_t *)0x0) goto LAB_01e7d43a;
    }
  }
  else {
    if (newp == (void *)0x0) {
      peVar3 = duckdb_je_arena_get_ehooks(paVar2);
      old_extent_hooks = (extent_hooks_t *)(peVar3->ptr).repr;
    }
    else {
      iVar6 = iVar5;
      if (newlen != 8) goto LAB_01e7d43a;
      old_extent_hooks = duckdb_je_arena_set_extent_hooks(tsd,paVar2,*newp);
    }
    if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
      uVar4 = *oldlenp;
      if (uVar4 != 8) {
LAB_01e7d41b:
        __n = 8;
        if (uVar4 < 8) {
          __n = uVar4;
        }
        switchD_01939fa4::default(oldp,&old_extent_hooks,__n);
        *oldlenp = __n;
        iVar6 = iVar5;
        goto LAB_01e7d43a;
      }
      *(extent_hooks_t **)oldp = old_extent_hooks;
    }
  }
  iVar6 = 0;
LAB_01e7d43a:
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  return iVar6;
}

Assistant:

static int
arena_i_extent_hooks_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned arena_ind;
	arena_t *arena;

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	MIB_UNSIGNED(arena_ind, 1);
	if (arena_ind < narenas_total_get()) {
		extent_hooks_t *old_extent_hooks;
		arena = arena_get(tsd_tsdn(tsd), arena_ind, false);
		if (arena == NULL) {
			if (arena_ind >= narenas_auto) {
				ret = EFAULT;
				goto label_return;
			}
			old_extent_hooks =
			    (extent_hooks_t *)&ehooks_default_extent_hooks;
			READ(old_extent_hooks, extent_hooks_t *);
			if (newp != NULL) {
				/* Initialize a new arena as a side effect. */
				extent_hooks_t *new_extent_hooks
				    JEMALLOC_CC_SILENCE_INIT(NULL);
				WRITE(new_extent_hooks, extent_hooks_t *);
				arena_config_t config = arena_config_default;
				config.extent_hooks = new_extent_hooks;

				arena = arena_init(tsd_tsdn(tsd), arena_ind,
				    &config);
				if (arena == NULL) {
					ret = EFAULT;
					goto label_return;
				}
			}
		} else {
			if (newp != NULL) {
				extent_hooks_t *new_extent_hooks
				    JEMALLOC_CC_SILENCE_INIT(NULL);
				WRITE(new_extent_hooks, extent_hooks_t *);
				old_extent_hooks = arena_set_extent_hooks(tsd,
				    arena, new_extent_hooks);
				READ(old_extent_hooks, extent_hooks_t *);
			} else {
				old_extent_hooks =
				    ehooks_get_extent_hooks_ptr(
					arena_get_ehooks(arena));
				READ(old_extent_hooks, extent_hooks_t *);
			}
		}
	} else {
		ret = EFAULT;
		goto label_return;
	}
	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}